

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void scm_resize(int64_t w,int64_t h)

{
  cell_map local_38;
  long local_18;
  int64_t h_local;
  int64_t w_local;
  
  local_18 = h;
  h_local = w;
  scm_stop();
  if (0 < h_local) {
    width = (int)h_local;
  }
  if (0 < local_18) {
    height = (int)local_18;
  }
  cell_map::cell_map(&local_38,width,height);
  cell_map::operator=(&grid,&local_38);
  cell_map::~cell_map(&local_38);
  paint_grid();
  return;
}

Assistant:

void scm_resize(int64_t w, int64_t h)
  {
  scm_stop();
  if (w > 0)
    width = (int)w;
  if (h > 0)
    height = (int)h;
  grid = cell_map(width, height);
  paint_grid();
  }